

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

DdNode * Llb_ManConstructQuantCubeBwd(Llb_Man_t *p,Llb_Grp_t *pGroup,int iGrpPlace)

{
  DdManager *pDVar1;
  abctime aVar2;
  int iVar3;
  DdNode *n;
  Aig_Obj_t *pAVar4;
  DdNode *pDVar5;
  int iVar6;
  
  pDVar1 = p->dd;
  aVar2 = pDVar1->TimeStop;
  pDVar1->TimeStop = 0;
  n = Cudd_ReadOne(pDVar1);
  Cudd_Ref(n);
  iVar6 = 0;
  do {
    if (pGroup->vIns->nSize <= iVar6) {
      iVar6 = 0;
      do {
        if (pGroup->vOuts->nSize <= iVar6) {
          Cudd_Deref(n);
          p->dd->TimeStop = aVar2;
          return n;
        }
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vOuts,iVar6);
        iVar3 = Saig_ObjIsPi(p->pAig,pAVar4);
        pDVar5 = n;
        if (iVar3 == 0) {
          iVar3 = Vec_IntEntry(p->vVarBegs,pAVar4->Id);
          if (iGrpPlace < iVar3) {
            __assert_fail("iGroupFirst <= iGrpPlace",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Reach.c"
                          ,0x112,
                          "DdNode *Llb_ManConstructQuantCubeBwd(Llb_Man_t *, Llb_Grp_t *, int)");
          }
          if (iGrpPlace <= iVar3) {
            pDVar1 = p->dd;
            iVar3 = Vec_IntEntry(p->vObj2Var,pAVar4->Id);
            pDVar5 = Cudd_bddIthVar(pDVar1,iVar3);
            pDVar5 = Cudd_bddAnd(p->dd,n,pDVar5);
            Cudd_Ref(pDVar5);
            Cudd_RecursiveDeref(p->dd,n);
          }
        }
        iVar6 = iVar6 + 1;
        n = pDVar5;
      } while( true );
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vIns,iVar6);
    iVar3 = Saig_ObjIsPi(p->pAig,pAVar4);
    pDVar5 = n;
    if (iVar3 == 0) {
      iVar3 = Vec_IntEntry(p->vVarBegs,pAVar4->Id);
      if (iGrpPlace < iVar3) {
        __assert_fail("iGroupFirst <= iGrpPlace",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Reach.c"
                      ,0x106,"DdNode *Llb_ManConstructQuantCubeBwd(Llb_Man_t *, Llb_Grp_t *, int)");
      }
      if (iGrpPlace <= iVar3) {
        pDVar1 = p->dd;
        iVar3 = Vec_IntEntry(p->vObj2Var,pAVar4->Id);
        pDVar5 = Cudd_bddIthVar(pDVar1,iVar3);
        pDVar5 = Cudd_bddAnd(p->dd,n,pDVar5);
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDeref(p->dd,n);
      }
    }
    iVar6 = iVar6 + 1;
    n = pDVar5;
  } while( true );
}

Assistant:

DdNode * Llb_ManConstructQuantCubeBwd( Llb_Man_t * p, Llb_Grp_t * pGroup, int iGrpPlace )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bTemp, * bVar;
    int i, iGroupFirst;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
    {
        if ( Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGrpPlace );
        if ( iGroupFirst < iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        if ( Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGrpPlace );
        if ( iGroupFirst < iGrpPlace )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bRes );
    p->dd->TimeStop = TimeStop;
    return bRes;
}